

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Translator * __thiscall helics::Federate::getTranslator(Federate *this,string_view translatorName)

{
  string_view addition;
  string_view name;
  string_view name_00;
  bool bVar1;
  pointer this_00;
  char *in_RDX;
  Federate *in_RSI;
  ConnectorFederateManager *in_RDI;
  Translator *trans;
  char *in_stack_ffffffffffffff98;
  Translator *local_8;
  
  std::
  unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
  ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                *)0x21a125);
  name._M_str = in_RDX;
  name._M_len = (size_t)in_RSI;
  local_8 = ConnectorFederateManager::getTranslator(in_RDI,name);
  bVar1 = Interface::isValid((Interface *)0x21a166);
  if (!bVar1) {
    this_00 = std::
              unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
              ::operator->((unique_ptr<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                            *)0x21a17c);
    addition._M_str = in_stack_ffffffffffffff98;
    addition._M_len = (size_t)in_RDX;
    localNameGenerator_abi_cxx11_(in_RSI,addition);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    name_00._M_str = in_RDX;
    name_00._M_len = (size_t)in_RSI;
    local_8 = ConnectorFederateManager::getTranslator(in_RDI,name_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return local_8;
}

Assistant:

Translator& Federate::getTranslator(std::string_view translatorName)
{
    Translator& trans = cManager->getTranslator(translatorName);
    if (!trans.isValid()) {
        return cManager->getTranslator(localNameGenerator(translatorName));
    }
    return trans;
}